

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh.cpp
# Opt level: O2

int __thiscall ncnn::TanH::forward_inplace(TanH *this,Mat *bottom_top_blob,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  ulong uVar8;
  float fVar9;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  sVar1 = bottom_top_blob->cstep;
  sVar2 = bottom_top_blob->elemsize;
  uVar6 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar6;
  }
  pvVar7 = bottom_top_blob->data;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar6;
  }
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      fVar9 = tanhf(*(float *)((long)pvVar7 + uVar5 * 4));
      *(float *)((long)pvVar7 + uVar5 * 4) = fVar9;
    }
    pvVar7 = (void *)((long)pvVar7 + sVar1 * sVar2);
  }
  return 0;
}

Assistant:

int TanH::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        for (int i = 0; i < size; i++)
        {
            ptr[i] = tanhf(ptr[i]);
        }
    }

    return 0;
}